

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float32_lt_sparc64(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  byte bVar2;
  float32 fVar3;
  float32 fVar4;
  bool bVar5;
  
  fVar3 = float32_squash_input_denormal_sparc64(a,status);
  fVar4 = float32_squash_input_denormal_sparc64(b,status);
  if (((~fVar3 & 0x7f800000) == 0 && (fVar3 & 0x7fffff) != 0) ||
     ((fVar4 & 0x7fffff) != 0 && (~fVar4 & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
    bVar2 = 0;
  }
  else {
    if ((int)(fVar4 ^ fVar3) < 0) {
      bVar5 = ((fVar4 | fVar3) & 0x7fffffff) != 0;
      bVar1 = (int)fVar3 < 0;
    }
    else {
      bVar5 = fVar3 != fVar4;
      bVar1 = (int)fVar3 < 0 != fVar3 < fVar4;
    }
    bVar2 = bVar1 & bVar5;
  }
  return (int)bVar2;
}

Assistant:

int float32_lt(float32 a, float32 b, float_status *status)
{
    flag aSign, bSign;
    uint32_t av, bv;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    aSign = extractFloat32Sign( a );
    bSign = extractFloat32Sign( b );
    av = float32_val(a);
    bv = float32_val(b);
    if ( aSign != bSign ) return aSign && ( (uint32_t) ( ( av | bv )<<1 ) != 0 );
    return ( av != bv ) && ( aSign ^ ( av < bv ) );

}